

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.c
# Opt level: O0

void BrotliCompressFragmentTwoPassImpl16
               (MemoryManager *m,uint8_t *input,size_t input_size,int is_last,uint32_t *command_buf,
               uint8_t *literal_buf,int *table,size_t *storage_ix,uint8_t *storage)

{
  int iVar1;
  char cVar2;
  int iVar3;
  long *plVar4;
  ulong uVar5;
  size_t num_literals_00;
  long lVar6;
  byte bVar7;
  uint uVar8;
  bool bVar9;
  uint32_t *local_948;
  uint32_t *local_940;
  size_t min_match;
  uint8_t *literal_buf_local;
  uint32_t *command_buf_local;
  int is_last_local;
  size_t input_size_local;
  uint8_t *input_local;
  MemoryManager *m_local;
  size_t num_commands;
  size_t num_literals;
  uint8_t *literals;
  uint32_t *commands;
  size_t block_size;
  uint8_t *base_ip;
  size_t *local_8c8;
  uint64_t local_8c0;
  long local_8b8;
  int *local_8b0;
  uint8_t *local_8a8;
  uint32_t *local_8a0;
  int local_894;
  uint32_t *local_890;
  uint8_t *local_888;
  MemoryManager *local_880;
  ulong local_878;
  uint64_t v;
  uint8_t *p;
  size_t *local_860;
  undefined8 local_858;
  undefined8 local_850;
  undefined8 local_848;
  uint32_t *local_840;
  uint local_834;
  undefined4 local_830;
  uint32_t insert_1;
  uint32_t prev_hash_1;
  uint32_t cur_hash_1;
  uint64_t input_bytes_1;
  size_t matched_2;
  uint8_t *base_1;
  uint32_t prev_hash;
  uint32_t cur_hash;
  uint64_t input_bytes;
  int insert;
  int distance;
  size_t matched;
  uint8_t *base;
  uint32_t bytes_between_hash_lookups;
  uint32_t hash;
  uint8_t *candidate;
  uint8_t *next_ip;
  uint32_t skip;
  uint32_t next_hash;
  uint8_t *ip_limit;
  size_t len_limit;
  size_t kInputMarginBytes;
  uint8_t *puStack_7a8;
  int last_distance;
  uint8_t *next_emit;
  uint8_t *ip_end;
  size_t shift;
  uint8_t *ip;
  size_t *local_780;
  uint64_t local_778;
  long local_770;
  int *local_768;
  size_t local_760;
  uint32_t *local_758;
  uint32_t *local_750;
  uint8_t *local_748;
  uint32_t *local_740;
  uint32_t *local_738;
  ulong local_730;
  uint64_t h_22;
  uint8_t *local_720;
  long *local_718;
  ulong local_710;
  uint64_t h_1;
  uint8_t *local_700;
  long *local_6f8;
  ulong local_6f0;
  uint64_t h;
  uint8_t *local_6e0;
  long *local_6d8;
  uint64_t local_6d0;
  int *local_6c8;
  size_t local_6c0;
  uint local_6b4;
  uint64_t local_6b0;
  int *local_6a8;
  uint8_t *local_6a0;
  uint local_694;
  uint64_t local_690;
  int *local_688;
  uint8_t *local_680;
  uint local_674;
  ulong local_670;
  size_t matching_bits_1;
  uint64_t x_1;
  size_t limit2_1;
  size_t matched_3;
  ulong *local_648;
  long local_640;
  size_t local_638;
  ulong local_630;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched_1;
  ulong *local_608;
  long local_600;
  size_t local_5f8;
  int local_5f0;
  int local_5ec;
  uint32_t extra_4;
  uint32_t extra_3;
  uint32_t extra_2;
  uint32_t extra_1;
  uint32_t code;
  uint32_t nbits_1;
  uint32_t tail_1;
  uint32_t extra;
  uint32_t inscode;
  uint32_t prefix;
  uint32_t nbits;
  uint32_t tail;
  uint local_5b4;
  ulong local_5b0;
  ulong local_5a8;
  int local_5a0;
  int local_59c;
  uint32_t extra_18;
  uint32_t extra_17;
  uint32_t extra_16;
  uint32_t extra_15;
  uint32_t code_6;
  uint32_t nbits_9;
  uint32_t tail_8;
  uint32_t extra_14;
  uint32_t inscode_1;
  uint32_t prefix_5;
  uint32_t nbits_8;
  uint32_t tail_7;
  uint local_564;
  ulong local_560;
  ulong local_558;
  int local_550;
  uint local_54c;
  uint32_t extra_13;
  uint32_t distcode_1;
  uint32_t offset_1;
  uint32_t prefix_4;
  uint32_t nbits_7;
  uint32_t d_1;
  int local_52c;
  ulong local_528;
  int local_520;
  uint local_51c;
  uint32_t extra_5;
  uint32_t distcode;
  uint32_t offset;
  uint32_t prefix_1;
  uint32_t nbits_2;
  uint32_t d;
  int local_4fc;
  ulong local_4f8;
  long local_4f0;
  size_t extra_9;
  size_t extra_8;
  size_t code_3;
  size_t nbits_4;
  size_t tail_4;
  size_t extra_7;
  size_t code_2;
  size_t tail_3;
  size_t extra_6;
  size_t code_1;
  size_t prefix_2;
  size_t nbits_3;
  size_t tail_2;
  ulong local_480;
  size_t local_478;
  ulong local_470;
  ulong *local_468;
  ulong *local_460;
  ulong *local_458;
  ulong *local_450;
  ulong *local_448;
  ulong *local_440;
  ulong *local_438;
  ulong *local_430;
  long *local_428;
  long *local_420;
  long *local_418;
  ulong *local_410;
  ulong *local_408;
  ulong *local_400;
  ulong *local_3f8;
  ulong *local_3f0;
  ulong *local_3e8;
  ulong local_3e0;
  uint64_t h_5;
  uint8_t *local_3d0;
  undefined8 local_3c8;
  ulong local_3c0;
  ulong local_3b8;
  uint64_t h_4;
  uint8_t *local_3a8;
  undefined8 local_3a0;
  ulong local_398;
  ulong local_390;
  uint64_t h_3;
  uint8_t *local_380;
  undefined8 local_378;
  ulong local_370;
  ulong local_368;
  uint64_t h_2;
  uint8_t *local_358;
  undefined8 local_350;
  ulong local_348;
  ulong local_340;
  uint64_t h_15;
  uint8_t *local_330;
  undefined8 local_328;
  ulong local_320;
  ulong local_318;
  uint64_t h_14;
  uint8_t *local_308;
  undefined8 local_300;
  ulong local_2f8;
  ulong local_2f0;
  uint64_t h_13;
  uint8_t *local_2e0;
  undefined8 local_2d8;
  ulong local_2d0;
  ulong local_2c8;
  uint64_t h_12;
  uint8_t *local_2b8;
  undefined8 local_2b0;
  ulong local_2a8;
  ulong local_2a0;
  uint64_t h_21;
  uint8_t *local_290;
  undefined8 local_288;
  ulong local_280;
  ulong local_278;
  uint64_t h_20;
  uint8_t *local_268;
  undefined8 local_260;
  ulong local_258;
  ulong local_250;
  uint64_t h_19;
  uint8_t *local_240;
  undefined8 local_238;
  ulong local_230;
  ulong local_228;
  uint64_t h_18;
  uint8_t *local_218;
  undefined8 local_210;
  ulong local_208;
  ulong local_200;
  uint64_t h_17;
  uint8_t *local_1f0;
  undefined8 local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  uint64_t h_16;
  uint8_t *local_1c8;
  undefined8 local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  uint64_t h_11;
  uint8_t *local_1a0;
  undefined8 local_198;
  ulong local_190;
  ulong local_188;
  uint64_t h_10;
  uint8_t *local_178;
  undefined8 local_170;
  ulong local_168;
  ulong local_160;
  uint64_t h_9;
  uint8_t *local_150;
  undefined8 local_148;
  ulong local_140;
  ulong local_138;
  uint64_t h_8;
  uint8_t *local_128;
  undefined8 local_120;
  ulong local_118;
  ulong local_110;
  uint64_t h_7;
  uint8_t *local_100;
  undefined8 local_f8;
  ulong local_f0;
  ulong local_e8;
  uint64_t h_6;
  uint8_t *local_d8;
  undefined8 local_d0;
  ulong local_c8;
  long local_c0;
  size_t extra_12;
  size_t extra_11;
  size_t code_5;
  size_t nbits_6;
  size_t tail_6;
  size_t extra_10;
  size_t code_4;
  size_t prefix_3;
  size_t nbits_5;
  size_t tail_5;
  ulong local_68;
  size_t local_60;
  ulong local_58;
  int *local_50;
  uint8_t *local_48;
  int *local_40;
  uint8_t *local_38;
  int *local_30;
  size_t local_28;
  ulong local_20;
  ulong *local_18;
  
  local_8b0 = table;
  local_8b8 = 0x10;
  local_8c0 = 6;
  local_8c8 = storage_ix;
  base_ip = storage;
  block_size = (size_t)input;
  local_8a8 = literal_buf;
  local_8a0 = command_buf;
  local_894 = is_last;
  local_890 = (uint32_t *)input_size;
  local_888 = input;
  local_880 = m;
  while( true ) {
    if (local_890 == (uint32_t *)0x0) {
      return;
    }
    local_840 = local_890;
    local_848 = 0x20000;
    if (local_890 < (uint32_t *)0x20000) {
      local_940 = local_890;
    }
    else {
      local_940 = (uint32_t *)0x20000;
    }
    commands = local_940;
    literals = (uint8_t *)local_8a0;
    num_literals = (size_t)local_8a8;
    local_748 = local_888;
    local_750 = local_940;
    local_758 = local_890;
    local_760 = block_size;
    local_768 = local_8b0;
    local_770 = local_8b8;
    local_778 = local_8c0;
    local_780 = &num_literals;
    ip = (uint8_t *)&literals;
    shift = (size_t)local_888;
    ip_end = (uint8_t *)(0x40 - local_8b8);
    next_emit = local_888 + (long)local_940;
    puStack_7a8 = local_888;
    kInputMarginBytes._4_4_ = -1;
    len_limit = 0x10;
    plVar4 = (long *)candidate;
    if ((uint32_t *)0xf < local_940) break;
LAB_0017f863:
    candidate = (uint8_t *)plVar4;
    if (puStack_7a8 < next_emit) {
      local_834 = (int)next_emit - (int)puStack_7a8;
      _nbits_8 = ip;
      if (local_834 < 6) {
        **(uint **)ip = local_834;
      }
      else if (local_834 < 0x82) {
        prefix_5 = local_834 - 2;
        local_558 = (ulong)prefix_5;
        iVar3 = 0x1f;
        if (prefix_5 != 0) {
          for (; prefix_5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        inscode_1 = iVar3 - 1;
        extra_14 = prefix_5 >> ((byte)inscode_1 & 0x1f);
        tail_8 = inscode_1 * 2 + extra_14 + 2;
        nbits_9 = prefix_5 - (extra_14 << ((byte)inscode_1 & 0x1f));
        **(uint **)ip = tail_8 | nbits_9 * 0x100;
      }
      else if (local_834 < 0x842) {
        code_6 = local_834 - 0x42;
        local_560 = (ulong)code_6;
        extra_15 = 0x1f;
        if (code_6 != 0) {
          for (; code_6 >> extra_15 == 0; extra_15 = extra_15 - 1) {
          }
        }
        extra_16 = extra_15 + 10;
        extra_17 = code_6 - (1 << ((byte)extra_15 & 0x1f));
        **(uint **)ip = extra_16 | extra_17 * 0x100;
      }
      else if (local_834 < 0x1842) {
        extra_18 = local_834 - 0x842;
        **(uint **)ip = extra_18 * 0x100 | 0x15;
      }
      else if (local_834 < 0x5842) {
        local_59c = local_834 - 0x1842;
        **(uint **)ip = local_59c * 0x100 | 0x16;
      }
      else {
        local_5a0 = local_834 - 0x5842;
        **(uint **)ip = local_5a0 * 0x100 | 0x17;
      }
      local_564 = local_834;
      *(long *)ip = *(long *)ip + 4;
      memcpy((void *)*local_780,puStack_7a8,(ulong)local_834);
      *local_780 = *local_780 + (ulong)local_834;
    }
    num_literals_00 = num_literals - (long)local_8a8;
    iVar3 = ShouldCompress(local_888,(size_t)commands,num_literals_00);
    if (iVar3 == 0) {
      EmitUncompressedMetaBlock(local_888,(size_t)commands,local_8c8,base_ip);
    }
    else {
      lVar6 = (long)literals - (long)local_8a0;
      BrotliStoreMetaBlockHeader((size_t)commands,0,local_8c8,base_ip);
      local_850 = 0xd;
      local_858 = 0;
      local_860 = local_8c8;
      p = base_ip;
      v = (uint64_t)(base_ip + (*local_8c8 >> 3));
      local_878 = 0L << ((byte)*local_8c8 & 7) | (ulong)(byte)*(ulong *)v;
      *(ulong *)v = local_878;
      *local_8c8 = *local_8c8 + 0xd;
      local_20 = local_878;
      local_18 = (ulong *)v;
      StoreCommands(local_880,local_8a8,num_literals_00,local_8a0,lVar6 >> 2,local_8c8,base_ip);
    }
    local_888 = (uint8_t *)((long)commands + (long)local_888);
    local_890 = (uint32_t *)((long)local_890 - (long)commands);
  }
  local_738 = (uint32_t *)((long)local_940 - local_8c0);
  local_740 = local_890 + -4;
  local_948 = local_740;
  if (local_738 < local_740) {
    local_948 = local_738;
  }
  ip_limit = (uint8_t *)local_948;
  _skip = (long *)(local_888 + (long)local_948);
  local_6d8 = (long *)(local_888 + 1);
  h = local_8c0;
  local_6f0 = (*local_6d8 << (('\b' - (char)local_8c0) * '\b' & 0x3fU)) * 0x1e35a7bd;
  next_ip._4_4_ = (uint)(local_6f0 >> ((byte)ip_end & 0x3f));
  shift = (size_t)local_6d8;
  local_6e0 = ip_end;
  local_428 = local_6d8;
  do {
    next_ip._0_4_ = 0x20;
    candidate = (uint8_t *)shift;
    plVar4 = (long *)candidate;
LAB_0017d709:
    do {
      candidate = (uint8_t *)plVar4;
      base._4_4_ = next_ip._4_4_;
      uVar8 = (uint)next_ip + 1;
      base._0_4_ = (uint)next_ip >> 5;
      shift = (size_t)candidate;
      plVar4 = (long *)(candidate + (uint)base);
      next_ip._0_4_ = uVar8;
      if (_skip < plVar4) goto LAB_0017f863;
      local_700 = ip_end;
      h_1 = local_778;
      local_710 = (*plVar4 << (('\b' - (char)local_778) * '\b' & 0x3fU)) * 0x1e35a7bd;
      uVar8 = (uint)(local_710 >> ((byte)ip_end & 0x3f));
      local_688 = (int *)(candidate + -(long)kInputMarginBytes._4_4_);
      local_680 = candidate;
      local_690 = local_778;
      local_48 = candidate;
      if (*(int *)candidate == *local_688) {
        if (local_778 == 4) {
          local_674 = 1;
        }
        else {
          bVar9 = false;
          if (candidate[4] == (uint8_t)local_688[1]) {
            bVar9 = candidate[5] == *(uint8_t *)((long)local_688 + 5);
          }
          local_674 = (uint)bVar9;
        }
      }
      else {
        local_674 = 0;
      }
      iVar3 = (int)candidate;
      local_6f8 = plVar4;
      local_420 = plVar4;
      local_50 = local_688;
      if ((local_674 == 0) || (candidate <= local_688)) {
        _bytes_between_hash_lookups = (int *)(local_760 + (long)local_768[next_ip._4_4_]);
        local_768[next_ip._4_4_] = iVar3 - (int)local_760;
        local_6a0 = candidate;
        local_6b0 = local_778;
        local_38 = candidate;
        if (*(int *)candidate == *_bytes_between_hash_lookups) {
          if (local_778 == 4) {
            local_694 = 1;
          }
          else {
            bVar9 = false;
            if (candidate[4] == (uint8_t)_bytes_between_hash_lookups[1]) {
              bVar9 = candidate[5] == *(uint8_t *)((long)_bytes_between_hash_lookups + 5);
            }
            local_694 = (uint)bVar9;
          }
        }
        else {
          local_694 = 0;
        }
        next_ip._4_4_ = uVar8;
        local_6a8 = _bytes_between_hash_lookups;
        local_40 = _bytes_between_hash_lookups;
        if (local_694 == 0) goto LAB_0017d709;
      }
      else {
        local_768[next_ip._4_4_] = iVar3 - (int)local_760;
        _bytes_between_hash_lookups = local_688;
      }
      next_ip._4_4_ = uVar8;
    } while (0x3fff0 < (long)candidate - (long)_bytes_between_hash_lookups);
    matched = (size_t)candidate;
    local_600 = (long)_bytes_between_hash_lookups + local_778;
    local_608 = (ulong *)(candidate + local_778);
    matched_1 = (size_t)(next_emit + (-local_778 - (long)candidate));
    limit2 = 0;
    x = (matched_1 >> 3) + 1;
LAB_0017dae6:
    x = x - 1;
    if (x != 0) {
      local_450 = local_608;
      local_458 = (ulong *)(local_600 + limit2);
      if (*local_608 == *local_458) break;
      local_460 = local_608;
      local_468 = (ulong *)(local_600 + limit2);
      iVar1 = 0;
      matching_bits = *local_608 ^ *local_468;
      for (uVar5 = matching_bits; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000) {
        iVar1 = iVar1 + 1;
      }
      local_630 = (ulong)iVar1;
      local_5f8 = (local_630 >> 3) + limit2;
      goto LAB_0017dc89;
    }
    matched_1 = (matched_1 & 7) + 1;
    while (matched_1 = matched_1 - 1, matched_1 != 0) {
      if (*(char *)(local_600 + limit2) != (char)*local_608) {
        local_5f8 = limit2;
        goto LAB_0017dc89;
      }
      local_608 = (ulong *)((long)local_608 + 1);
      limit2 = limit2 + 1;
    }
    local_5f8 = limit2;
LAB_0017dc89:
    _insert = local_778 + local_5f8;
    input_bytes._4_4_ = iVar3 - (int)_bytes_between_hash_lookups;
    input_bytes._0_4_ = iVar3 - (int)puStack_7a8;
    shift = (size_t)(candidate + _insert);
    _nbits = ip;
    if ((uint)input_bytes < 6) {
      **(uint **)ip = (uint)input_bytes;
    }
    else if ((uint)input_bytes < 0x82) {
      prefix = (uint)input_bytes - 2;
      local_5a8 = (ulong)prefix;
      iVar3 = 0x1f;
      if (prefix != 0) {
        for (; prefix >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      inscode = iVar3 - 1;
      extra = prefix >> ((byte)inscode & 0x1f);
      tail_1 = inscode * 2 + extra + 2;
      nbits_1 = prefix - (extra << ((byte)inscode & 0x1f));
      **(uint **)ip = tail_1 | nbits_1 * 0x100;
    }
    else if ((uint)input_bytes < 0x842) {
      code = (uint)input_bytes - 0x42;
      local_5b0 = (ulong)code;
      extra_1 = 0x1f;
      if (code != 0) {
        for (; code >> extra_1 == 0; extra_1 = extra_1 - 1) {
        }
      }
      extra_2 = extra_1 + 10;
      extra_3 = code - (1 << ((byte)extra_1 & 0x1f));
      **(uint **)ip = extra_2 | extra_3 * 0x100;
    }
    else if ((uint)input_bytes < 0x1842) {
      extra_4 = (uint)input_bytes - 0x842;
      **(uint **)ip = extra_4 * 0x100 | 0x15;
    }
    else if ((uint)input_bytes < 0x5842) {
      local_5ec = (uint)input_bytes - 0x1842;
      **(uint **)ip = local_5ec * 0x100 | 0x16;
    }
    else {
      local_5f0 = (uint)input_bytes - 0x5842;
      **(uint **)ip = local_5f0 * 0x100 | 0x17;
    }
    candidate = (uint8_t *)plVar4;
    limit2 = local_5f8;
    local_5b4 = (uint)input_bytes;
    *(long *)ip = *(long *)ip + 4;
    memcpy((void *)*local_780,puStack_7a8,(long)(int)(uint)input_bytes);
    *local_780 = *local_780 + (long)(int)(uint)input_bytes;
    if (input_bytes._4_4_ == kInputMarginBytes._4_4_) {
      **(undefined4 **)ip = 0x40;
      *(long *)ip = *(long *)ip + 4;
    }
    else {
      local_4fc = input_bytes._4_4_;
      _nbits_2 = ip;
      prefix_1 = input_bytes._4_4_ + 3;
      local_4f8 = (ulong)prefix_1;
      iVar3 = 0x1f;
      if (prefix_1 != 0) {
        for (; prefix_1 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      offset = iVar3 - 1;
      distcode = prefix_1 >> ((byte)offset & 0x1f) & 1;
      extra_5 = distcode + 2 << ((byte)offset & 0x1f);
      local_51c = (iVar3 + -2) * 2 + distcode + 0x50;
      local_520 = prefix_1 - extra_5;
      **(uint **)ip = local_51c | local_520 * 0x100;
      *(long *)ip = *(long *)ip + 4;
      kInputMarginBytes._4_4_ = input_bytes._4_4_;
    }
    local_480 = _insert;
    tail_2 = (size_t)ip;
    if (_insert < 0xc) {
      **(int **)ip = (int)_insert + 0x14;
      *(long *)ip = *(long *)ip + 4;
    }
    else if (_insert < 0x48) {
      nbits_3 = _insert - 8;
      iVar3 = 0x1f;
      if ((uint)nbits_3 != 0) {
        for (; (uint)nbits_3 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      prefix_2 = (size_t)(iVar3 - 1U);
      bVar7 = (byte)(iVar3 - 1U);
      code_1 = nbits_3 >> (bVar7 & 0x3f);
      extra_6 = prefix_2 * 2 + code_1 + 0x1c;
      tail_3 = nbits_3 - (code_1 << (bVar7 & 0x3f));
      **(uint **)ip = (uint)extra_6 | (int)tail_3 * 0x100;
      local_470 = nbits_3;
      *(long *)ip = *(long *)ip + 4;
    }
    else if (_insert < 0x88) {
      code_2 = _insert - 8;
      extra_7 = (code_2 >> 5) + 0x36;
      tail_4 = code_2 & 0x1f;
      **(uint **)ip = (uint)extra_7 | (uint)(tail_4 << 8);
      *(long *)ip = *(long *)ip + 4;
      **(undefined4 **)tail_2 = 0x40;
      *(long *)tail_2 = *(long *)tail_2 + 4;
    }
    else if (_insert < 0x848) {
      nbits_4 = _insert - 0x48;
      uVar8 = 0x1f;
      if ((uint)nbits_4 != 0) {
        for (; (uint)nbits_4 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      code_3 = (size_t)uVar8;
      extra_8 = code_3 + 0x34;
      extra_9 = nbits_4 - (1L << ((byte)uVar8 & 0x3f));
      **(uint **)ip = (uint)extra_8 | (int)extra_9 * 0x100;
      local_478 = nbits_4;
      *(long *)ip = *(long *)ip + 4;
      **(undefined4 **)tail_2 = 0x40;
      *(long *)tail_2 = *(long *)tail_2 + 4;
    }
    else {
      local_4f0 = _insert - 0x848;
      **(uint **)ip = (int)local_4f0 * 0x100 | 0x3f;
      *(long *)ip = *(long *)ip + 4;
      **(undefined4 **)tail_2 = 0x40;
      *(long *)tail_2 = *(long *)tail_2 + 4;
    }
    puStack_7a8 = (uint8_t *)shift;
    plVar4 = (long *)candidate;
    if (_skip <= shift) goto LAB_0017f863;
    iVar3 = (int)shift;
    iVar1 = (int)local_760;
    cVar2 = (char)local_778;
    bVar7 = (byte)ip_end;
    if (local_778 == 4) {
      local_410 = (ulong *)(shift - 3);
      _prev_hash = *local_410;
      local_350 = 3;
      local_358 = ip_end;
      h_2 = local_778;
      local_368 = ((_prev_hash >> 0x18) << (('\b' - cVar2) * '\b' & 0x3fU)) * 0x1e35a7bd;
      base_1._4_4_ = (uint)(local_368 >> (bVar7 & 0x3f));
      local_378 = 0;
      local_380 = ip_end;
      h_3 = local_778;
      local_390 = (_prev_hash << (('\b' - cVar2) * '\b' & 0x3fU)) * 0x1e35a7bd;
      local_768[local_390 >> (bVar7 & 0x3f) & 0xffffffff] = (iVar3 - iVar1) + -3;
      local_3a0 = 1;
      local_3a8 = ip_end;
      h_4 = local_778;
      local_3b8 = ((_prev_hash >> 8) << (('\b' - cVar2) * '\b' & 0x3fU)) * 0x1e35a7bd;
      local_768[local_3b8 >> (bVar7 & 0x3f) & 0xffffffff] = (iVar3 - iVar1) + -2;
      local_3c8 = 0;
      local_3d0 = ip_end;
      h_5 = local_778;
      local_3e0 = (_prev_hash << (('\b' - cVar2) * '\b' & 0x3fU)) * 0x1e35a7bd;
      uVar5 = local_3e0 >> (bVar7 & 0x3f);
      base_1._0_4_ = (undefined4)uVar5;
      local_768[uVar5 & 0xffffffff] = (iVar3 - iVar1) + -1;
      local_3c0 = _prev_hash;
      local_398 = _prev_hash;
      local_370 = _prev_hash;
      local_348 = _prev_hash;
    }
    else {
      local_3e8 = (ulong *)(shift - 5);
      local_118 = *local_3e8;
      local_d0 = 0;
      local_d8 = ip_end;
      h_6 = local_778;
      local_e8 = (local_118 << (('\b' - cVar2) * '\b' & 0x3fU)) * 0x1e35a7bd;
      local_768[local_e8 >> (bVar7 & 0x3f) & 0xffffffff] = (iVar3 - iVar1) + -5;
      local_f8 = 1;
      local_100 = ip_end;
      h_7 = local_778;
      local_110 = ((local_118 >> 8) << (('\b' - cVar2) * '\b' & 0x3fU)) * 0x1e35a7bd;
      local_768[local_110 >> (bVar7 & 0x3f) & 0xffffffff] = (iVar3 - iVar1) + -4;
      local_120 = 2;
      local_128 = ip_end;
      h_8 = local_778;
      local_138 = ((local_118 >> 0x10) << (('\b' - cVar2) * '\b' & 0x3fU)) * 0x1e35a7bd;
      local_768[local_138 >> (bVar7 & 0x3f) & 0xffffffff] = (iVar3 - iVar1) + -3;
      local_3f0 = (ulong *)(shift - 2);
      _prev_hash = *local_3f0;
      local_148 = 2;
      local_150 = ip_end;
      h_9 = local_778;
      local_160 = ((_prev_hash >> 0x10) << (('\b' - cVar2) * '\b' & 0x3fU)) * 0x1e35a7bd;
      base_1._4_4_ = (uint)(local_160 >> (bVar7 & 0x3f));
      local_170 = 0;
      local_178 = ip_end;
      h_10 = local_778;
      local_188 = (_prev_hash << (('\b' - cVar2) * '\b' & 0x3fU)) * 0x1e35a7bd;
      local_768[local_188 >> (bVar7 & 0x3f) & 0xffffffff] = (iVar3 - iVar1) + -2;
      local_198 = 1;
      local_1a0 = ip_end;
      h_11 = local_778;
      local_1b0 = ((_prev_hash >> 8) << (('\b' - cVar2) * '\b' & 0x3fU)) * 0x1e35a7bd;
      uVar5 = local_1b0 >> (bVar7 & 0x3f);
      base_1._0_4_ = (undefined4)uVar5;
      local_768[uVar5 & 0xffffffff] = (iVar3 - iVar1) + -1;
      local_190 = _prev_hash;
      local_168 = _prev_hash;
      local_140 = _prev_hash;
      local_f0 = local_118;
      local_c8 = local_118;
    }
    _bytes_between_hash_lookups = (int *)(local_760 + (long)local_768[base_1._4_4_]);
    local_768[base_1._4_4_] = iVar3 - iVar1;
    while( true ) {
      bVar9 = false;
      if ((long)(shift - (long)_bytes_between_hash_lookups) < 0x3fff1) {
        local_6c0 = shift;
        local_6c8 = _bytes_between_hash_lookups;
        local_6d0 = local_778;
        local_28 = shift;
        local_30 = _bytes_between_hash_lookups;
        if (*(int *)shift == *_bytes_between_hash_lookups) {
          if (local_778 == 4) {
            local_6b4 = 1;
          }
          else {
            bVar9 = false;
            if (*(char *)(shift + 4) == (char)_bytes_between_hash_lookups[1]) {
              bVar9 = *(char *)(shift + 5) == *(char *)((long)_bytes_between_hash_lookups + 5);
            }
            local_6b4 = (uint)bVar9;
          }
        }
        else {
          local_6b4 = 0;
        }
        bVar9 = local_6b4 != 0;
      }
      if (!bVar9) break;
      matched_2 = shift;
      local_640 = (long)_bytes_between_hash_lookups + local_778;
      local_648 = (ulong *)(shift + local_778);
      matched_3 = (size_t)(next_emit + (-local_778 - shift));
      limit2_1 = 0;
      x_1 = (matched_3 >> 3) + 1;
LAB_0017ec3b:
      x_1 = x_1 - 1;
      if (x_1 != 0) {
        local_430 = local_648;
        local_438 = (ulong *)(local_640 + limit2_1);
        if (*local_648 == *local_438) goto LAB_0017ec9d;
        local_440 = local_648;
        local_448 = (ulong *)(local_640 + limit2_1);
        iVar3 = 0;
        matching_bits_1 = *local_648 ^ *local_448;
        for (uVar5 = matching_bits_1; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000) {
          iVar3 = iVar3 + 1;
        }
        local_670 = (ulong)iVar3;
        local_638 = (local_670 >> 3) + limit2_1;
        goto LAB_0017edde;
      }
      matched_3 = (matched_3 & 7) + 1;
      while (matched_3 = matched_3 - 1, matched_3 != 0) {
        if (*(char *)(local_640 + limit2_1) != (char)*local_648) {
          local_638 = limit2_1;
          goto LAB_0017edde;
        }
        local_648 = (ulong *)((long)local_648 + 1);
        limit2_1 = limit2_1 + 1;
      }
      local_638 = limit2_1;
LAB_0017edde:
      input_bytes_1 = local_778 + local_638;
      kInputMarginBytes._4_4_ = (int)shift - (int)_bytes_between_hash_lookups;
      tail_5 = (size_t)ip;
      if (input_bytes_1 < 10) {
        **(int **)ip = (int)input_bytes_1 + 0x26;
      }
      else if (input_bytes_1 < 0x86) {
        nbits_5 = input_bytes_1 - 6;
        iVar3 = 0x1f;
        if ((uint)nbits_5 != 0) {
          for (; (uint)nbits_5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        prefix_3 = (size_t)(iVar3 - 1U);
        bVar7 = (byte)(iVar3 - 1U);
        code_4 = nbits_5 >> (bVar7 & 0x3f);
        extra_10 = prefix_3 * 2 + code_4 + 0x2c;
        tail_6 = nbits_5 - (code_4 << (bVar7 & 0x3f));
        **(uint **)ip = (uint)extra_10 | (int)tail_6 * 0x100;
        local_58 = nbits_5;
      }
      else if (input_bytes_1 < 0x846) {
        nbits_6 = input_bytes_1 - 0x46;
        uVar8 = 0x1f;
        if ((uint)nbits_6 != 0) {
          for (; (uint)nbits_6 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        code_5 = (size_t)uVar8;
        extra_11 = code_5 + 0x34;
        extra_12 = nbits_6 - (1L << ((byte)uVar8 & 0x3f));
        **(uint **)ip = (uint)extra_11 | (int)extra_12 * 0x100;
        local_60 = nbits_6;
      }
      else {
        local_c0 = input_bytes_1 - 0x846;
        **(uint **)ip = (int)local_c0 * 0x100 | 0x3f;
      }
      shift = input_bytes_1 + shift;
      limit2_1 = local_638;
      local_68 = input_bytes_1;
      *(long *)ip = *(long *)ip + 4;
      local_52c = kInputMarginBytes._4_4_;
      _nbits_7 = ip;
      prefix_4 = kInputMarginBytes._4_4_ + 3;
      local_528 = (ulong)prefix_4;
      iVar3 = 0x1f;
      if (prefix_4 != 0) {
        for (; prefix_4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      offset_1 = iVar3 - 1;
      distcode_1 = prefix_4 >> ((byte)offset_1 & 0x1f) & 1;
      extra_13 = distcode_1 + 2 << ((byte)offset_1 & 0x1f);
      local_54c = (iVar3 + -2) * 2 + distcode_1 + 0x50;
      local_550 = prefix_4 - extra_13;
      **(uint **)ip = local_54c | local_550 * 0x100;
      *(long *)ip = *(long *)ip + 4;
      puStack_7a8 = (uint8_t *)shift;
      plVar4 = (long *)candidate;
      if (_skip <= shift) goto LAB_0017f863;
      iVar3 = (int)shift;
      iVar1 = (int)local_760;
      cVar2 = (char)local_778;
      bVar7 = (byte)ip_end;
      if (local_778 == 4) {
        local_408 = (ulong *)(shift - 3);
        _prev_hash_1 = *local_408;
        local_2b0 = 3;
        local_2b8 = ip_end;
        h_12 = local_778;
        local_2c8 = ((_prev_hash_1 >> 0x18) << (('\b' - cVar2) * '\b' & 0x3fU)) * 0x1e35a7bd;
        insert_1 = (uint32_t)(local_2c8 >> (bVar7 & 0x3f));
        local_2d8 = 0;
        local_2e0 = ip_end;
        h_13 = local_778;
        local_2f0 = (_prev_hash_1 << (('\b' - cVar2) * '\b' & 0x3fU)) * 0x1e35a7bd;
        local_768[local_2f0 >> (bVar7 & 0x3f) & 0xffffffff] = (iVar3 - iVar1) + -3;
        local_300 = 1;
        local_308 = ip_end;
        h_14 = local_778;
        local_318 = ((_prev_hash_1 >> 8) << (('\b' - cVar2) * '\b' & 0x3fU)) * 0x1e35a7bd;
        local_768[local_318 >> (bVar7 & 0x3f) & 0xffffffff] = (iVar3 - iVar1) + -2;
        local_328 = 2;
        local_330 = ip_end;
        h_15 = local_778;
        local_340 = ((_prev_hash_1 >> 0x10) << (('\b' - cVar2) * '\b' & 0x3fU)) * 0x1e35a7bd;
        uVar5 = local_340 >> (bVar7 & 0x3f);
        local_830 = (undefined4)uVar5;
        local_768[uVar5 & 0xffffffff] = (iVar3 - iVar1) + -1;
        local_320 = _prev_hash_1;
        local_2f8 = _prev_hash_1;
        local_2d0 = _prev_hash_1;
        local_2a8 = _prev_hash_1;
      }
      else {
        local_3f8 = (ulong *)(shift - 5);
        local_208 = *local_3f8;
        local_1c0 = 0;
        local_1c8 = ip_end;
        h_16 = local_778;
        local_1d8 = (local_208 << (('\b' - cVar2) * '\b' & 0x3fU)) * 0x1e35a7bd;
        local_768[local_1d8 >> (bVar7 & 0x3f) & 0xffffffff] = (iVar3 - iVar1) + -5;
        local_1e8 = 1;
        local_1f0 = ip_end;
        h_17 = local_778;
        local_200 = ((local_208 >> 8) << (('\b' - cVar2) * '\b' & 0x3fU)) * 0x1e35a7bd;
        local_768[local_200 >> (bVar7 & 0x3f) & 0xffffffff] = (iVar3 - iVar1) + -4;
        local_210 = 2;
        local_218 = ip_end;
        h_18 = local_778;
        local_228 = ((local_208 >> 0x10) << (('\b' - cVar2) * '\b' & 0x3fU)) * 0x1e35a7bd;
        local_768[local_228 >> (bVar7 & 0x3f) & 0xffffffff] = (iVar3 - iVar1) + -3;
        local_400 = (ulong *)(shift - 2);
        _prev_hash_1 = *local_400;
        local_238 = 2;
        local_240 = ip_end;
        h_19 = local_778;
        local_250 = ((_prev_hash_1 >> 0x10) << (('\b' - cVar2) * '\b' & 0x3fU)) * 0x1e35a7bd;
        insert_1 = (uint32_t)(local_250 >> (bVar7 & 0x3f));
        local_260 = 0;
        local_268 = ip_end;
        h_20 = local_778;
        local_278 = (_prev_hash_1 << (('\b' - cVar2) * '\b' & 0x3fU)) * 0x1e35a7bd;
        local_768[local_278 >> (bVar7 & 0x3f) & 0xffffffff] = (iVar3 - iVar1) + -2;
        local_288 = 1;
        local_290 = ip_end;
        h_21 = local_778;
        local_2a0 = ((_prev_hash_1 >> 8) << (('\b' - cVar2) * '\b' & 0x3fU)) * 0x1e35a7bd;
        uVar5 = local_2a0 >> (bVar7 & 0x3f);
        local_830 = (undefined4)uVar5;
        local_768[uVar5 & 0xffffffff] = (iVar3 - iVar1) + -1;
        local_280 = _prev_hash_1;
        local_258 = _prev_hash_1;
        local_230 = _prev_hash_1;
        local_1e0 = local_208;
        local_1b8 = local_208;
      }
      _bytes_between_hash_lookups = (int *)(local_760 + (long)local_768[insert_1]);
      local_768[insert_1] = iVar3 - iVar1;
    }
    local_718 = (long *)(shift + 1);
    local_720 = ip_end;
    h_22 = local_778;
    local_730 = (*local_718 << (('\b' - (char)local_778) * '\b' & 0x3fU)) * 0x1e35a7bd;
    next_ip._4_4_ = (uint)(local_730 >> ((byte)ip_end & 0x3f));
    puStack_7a8 = (uint8_t *)shift;
    shift = (size_t)local_718;
    local_418 = local_718;
  } while( true );
  local_608 = local_608 + 1;
  limit2 = limit2 + 8;
  goto LAB_0017dae6;
LAB_0017ec9d:
  local_648 = local_648 + 1;
  limit2_1 = limit2_1 + 8;
  goto LAB_0017ec3b;
}

Assistant:

void BrotliCompressFragmentTwoPass(
    MemoryManager* m, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, uint32_t* command_buf, uint8_t* literal_buf,
    int* table, size_t table_size, size_t* storage_ix, uint8_t* storage) {
  const size_t initial_storage_ix = *storage_ix;
  const size_t table_bits = Log2FloorNonZero(table_size);
  switch (table_bits) {
#define CASE_(B)                                      \
    case B:                                           \
      BrotliCompressFragmentTwoPassImpl ## B(         \
          m, input, input_size, is_last, command_buf, \
          literal_buf, table, storage_ix, storage);   \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: BROTLI_DCHECK(0); break;
  }

  /* If output is larger than single uncompressed block, rewrite it. */
  if (*storage_ix - initial_storage_ix > 31 + (input_size << 3)) {
    RewindBitPosition(initial_storage_ix, storage_ix, storage);
    EmitUncompressedMetaBlock(input, input_size, storage_ix, storage);
  }

  if (is_last) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
  }
}